

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histo.c
# Opt level: O1

int fits_get_expr_minmax
              (fitsfile *fptr,char *expr,double *datamin,double *datamax,int *datatype,int *status)

{
  double dVar1;
  int iVar2;
  double double_nulval;
  long nrows;
  long nelem;
  int naxis;
  parseInfo *local_1f8;
  double dStack_1f0;
  double local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  parseInfo Info;
  ParseData lParse;
  long naxes [5];
  
  double_nulval = -9.1191291391491e-36;
  if (*status != 0) {
    return *status;
  }
  local_1e8 = 0.0;
  uStack_1e0 = 0;
  local_1f8 = (parseInfo *)0x0;
  dStack_1f0 = 0.0;
  local_1d8 = 0;
  memset(&Info,0,0x90);
  memset(&lParse,0,0xe8);
  if (datatype != (int *)0x0) {
    *datatype = 0;
  }
  ffgky(fptr,0x29,"NAXIS2",&nrows,(char *)0x0,status);
  iVar2 = ffiprs(fptr,0,expr,5,&Info.datatype,&nelem,&naxis,naxes,&lParse,status);
  if (iVar2 != 0) goto LAB_00189c5a;
  if (datatype != (int *)0x0) {
    *datatype = Info.datatype;
  }
  if (-1 < nelem) {
    Info.parseData = &lParse;
    iVar2 = fits_parser_set_temporary_col(&lParse,&Info,nrows,&double_nulval,status);
    if (iVar2 == 0) {
      dStack_1f0 = -9.1191291391491e-36;
      local_1e8 = -9.1191291391491e-36;
      uStack_1e0 = 0;
      local_1d8 = 0;
      local_1f8 = &Info;
      iVar2 = ffiter(lParse.nCols,lParse.colData,0,0,histo_minmax_expr_workfn,&local_1f8,status);
      if (iVar2 == -1) {
        *status = 0;
      }
      if (datamin != (double *)0x0) {
        *datamin = dStack_1f0;
      }
      if (datamax != (double *)0x0) {
        *datamax = local_1e8;
      }
    }
    goto LAB_00189c5a;
  }
  if (Info.datatype < 0x29) {
    if (Info.datatype == 1) {
      if (lParse.Nodes[lParse.resultNode].value.data.log != '\0') {
LAB_00189d9d:
        dVar1 = 1.0;
        goto LAB_00189db3;
      }
    }
    else {
      if (Info.datatype != 0xe) goto LAB_00189c5a;
      if (lParse.Nodes[lParse.resultNode].value.data.log == '\x01') goto LAB_00189d9d;
    }
    dVar1 = 0.0;
  }
  else if (Info.datatype == 0x29) {
    dVar1 = (double)lParse.Nodes[lParse.resultNode].value.data.lng;
  }
  else {
    if (Info.datatype != 0x52) goto LAB_00189c5a;
    dVar1 = lParse.Nodes[lParse.resultNode].value.data.dbl;
  }
LAB_00189db3:
  *datamax = dVar1;
  *datamin = dVar1;
LAB_00189c5a:
  ffcprs(&lParse);
  return *status;
}

Assistant:

int fits_get_expr_minmax(fitsfile *fptr, char *expr, double *datamin, 
			 double *datamax, int *datatype, int *status)
/* 
   Simple utility routine to compute the min and max value in an expression
*/
{
   parseInfo Info;
   ParseData lParse;
   struct histo_minmax_workfn_struct minmaxWorkFn;
   int naxis, constant, typecode, newNullKwd=0;
   long nelem, naxes[MAXDIMS], repeat, width, nrows;
   int col_cnt, colNo;
   Node *result;
   char card[81], tform[16], nullKwd[9], tdimKwd[9];
   double double_nulval = DOUBLENULLVALUE;

   if( *status ) return( *status );

   memset(&minmaxWorkFn, 0, sizeof(minmaxWorkFn));
   memset(&Info, 0, sizeof(Info));
   memset(&lParse, 0, sizeof(lParse));
   if (datatype) *datatype = 0;

   ffgky(fptr, TLONG, "NAXIS2", &nrows, NULL, status); /* no. of rows */

   if( ffiprs( fptr, 0, expr, MAXDIMS, &Info.datatype, &nelem, &naxis,
               naxes, &lParse, status ) ) {

      ffcprs(&lParse);
      return( *status );
   }

   if (datatype) *datatype = Info.datatype;

   if( nelem<0 ) { /* Constant already computed */
      result  = lParse.Nodes + lParse.resultNode;
      switch( Info.datatype ) {
      case TDOUBLE: *datamin = *datamax = result->value.data.dbl; break;
      case TLONG:   *datamin = *datamax = (double) result->value.data.lng; break;
      case TLOGICAL:*datamin = *datamax = (double) ((result->value.data.log == 1)?1:0); break;
      case TBIT:    *datamin = *datamax = (double) ((result->value.data.str[0])?1:0); break;
      }
      ffcprs(&lParse);
      return( *status );
   }

   Info.parseData = &lParse;

   /* Add a temporary column which contains the expression value */
   if ( fits_parser_set_temporary_col( &lParse, &Info, nrows, &double_nulval, status) ) {
     ffcprs(&lParse);
     return( *status );
   }

   /* Initialize the work function computing min/max */
   minmaxWorkFn.Info = &Info;
   minmaxWorkFn.datamin = minmaxWorkFn.datamax = DOUBLENULLVALUE;
   minmaxWorkFn.ntotal = minmaxWorkFn.ngood = 0;
   
   if( ffiter( lParse.nCols, lParse.colData, 0, 0,
	       histo_minmax_expr_workfn, (void*)&minmaxWorkFn, status ) == -1 )
     *status = 0;  /* -1 indicates exitted without error before end... OK */

   if (datamin) *datamin = minmaxWorkFn.datamin;
   if (datamax) *datamax = minmaxWorkFn.datamax;

   ffcprs(&lParse);
   return(*status);

}